

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtabbar.cpp
# Opt level: O3

void __thiscall QTabBar::setTabsClosable(QTabBar *this,bool closable)

{
  QTabBarPrivate *this_00;
  long lVar1;
  void **ppvVar2;
  Tab **ppTVar3;
  long lVar4;
  bool bVar5;
  ButtonPosition position;
  QStyle *pQVar6;
  ulong uVar7;
  QWidget *widget;
  undefined4 *puVar8;
  QTabBarPrivate *d;
  ulong uVar9;
  undefined8 *puVar10;
  long lVar11;
  long in_FS_OFFSET;
  Connection local_60;
  code *local_58;
  ImplFn local_50;
  code *local_48;
  undefined8 local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QTabBarPrivate **)&(this->super_QWidget).field_0x8;
  if (((*(ushort *)&this_00->field_0x2d0 & 0x40) == 0) == closable) {
    *(ushort *)&this_00->field_0x2d0 =
         *(ushort *)&this_00->field_0x2d0 & 0xffbf | (ushort)closable << 6;
    pQVar6 = QWidget::style(&this->super_QWidget);
    position = (**(code **)(*(long *)pQVar6 + 0xf0))(pQVar6,0x5c,0,this,0);
    if (closable) {
      uVar7 = (this_00->tabList).d.size;
      if (uVar7 != 0) {
        uVar9 = 0;
        bVar5 = false;
        do {
          lVar1 = *(long *)&(this->super_QWidget).field_0x8;
          while (((uVar9 < *(ulong *)(lVar1 + 0x2e8) &&
                  (lVar11 = *(long *)(*(long *)(lVar1 + 0x2e0) + uVar9 * 8), lVar11 != 0)) &&
                 (*(long *)(lVar11 + (ulong)(position != LeftSide) * 8 + 200) != 0))) {
            uVar9 = uVar9 + 1;
            if (uVar7 <= uVar9) {
              if (!bVar5) goto LAB_0048faf7;
              goto LAB_0048faef;
            }
          }
          widget = (QWidget *)operator_new(0x28);
          anon_unknown.dwarf_10b69d9::CloseButton::CloseButton
                    ((CloseButton *)widget,&this->super_QWidget);
          local_48 = QAbstractButton::clicked;
          local_40 = 0;
          local_58 = QTabBarPrivate::closeTab;
          local_50 = (ImplFn)0x0;
          ppvVar2 = *(void ***)&(this_00->super_QWidgetPrivate).field_0x8;
          puVar8 = (undefined4 *)operator_new(0x20);
          *puVar8 = 1;
          *(code **)(puVar8 + 2) =
               QtPrivate::QPrivateSlotObject<void_(QTabBarPrivate::*)(),_QtPrivate::List<>,_void>::
               impl;
          *(code **)(puVar8 + 4) = QTabBarPrivate::closeTab;
          *(undefined8 *)(puVar8 + 6) = 0;
          QObject::connectImpl
                    ((QObject *)&local_60,(void **)widget,(QObject *)&local_48,ppvVar2,
                     (QSlotObjectBase *)&local_58,(ConnectionType)puVar8,(int *)0x0,
                     (QMetaObject *)0x0);
          QMetaObject::Connection::~Connection(&local_60);
          setTabButton(this,(int)uVar9,position,widget);
          uVar7 = (this_00->tabList).d.size;
          uVar9 = uVar9 + 1;
          bVar5 = true;
        } while (uVar9 < uVar7);
LAB_0048faef:
        QTabBarPrivate::layoutTabs(this_00);
      }
    }
    else {
      lVar1 = (this_00->tabList).d.size;
      if (lVar1 != 0) {
        ppTVar3 = (this_00->tabList).d.ptr;
        lVar11 = 0;
        do {
          lVar4 = *(long *)((long)ppTVar3 + lVar11);
          if (position == RightSide) {
            if (*(long *)(lVar4 + 0xd0) != 0) {
              puVar10 = (undefined8 *)(lVar4 + 0xd0);
              goto LAB_0048fad2;
            }
          }
          else if ((position == LeftSide) && (*(long *)(lVar4 + 200) != 0)) {
            puVar10 = (undefined8 *)(lVar4 + 200);
LAB_0048fad2:
            QObject::deleteLater();
            *puVar10 = 0;
          }
          lVar11 = lVar11 + 8;
        } while (lVar1 << 3 != lVar11);
      }
    }
LAB_0048faf7:
    QWidget::update(&this->super_QWidget);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QTabBar::setTabsClosable(bool closable)
{
    Q_D(QTabBar);
    if (d->closeButtonOnTabs == closable)
        return;
    d->closeButtonOnTabs = closable;
    ButtonPosition closeSide = (ButtonPosition)style()->styleHint(QStyle::SH_TabBar_CloseButtonPosition, nullptr, this);
    if (!closable) {
        for (auto tab : std::as_const(d->tabList)) {
            if (closeSide == LeftSide && tab->leftWidget) {
                tab->leftWidget->deleteLater();
                tab->leftWidget = nullptr;
            }
            if (closeSide == RightSide && tab->rightWidget) {
                tab->rightWidget->deleteLater();
                tab->rightWidget = nullptr;
            }
        }
    } else {
        bool newButtons = false;
        for (int i = 0; i < d->tabList.size(); ++i) {
            if (tabButton(i, closeSide))
                continue;
            newButtons = true;
            QAbstractButton *closeButton = new CloseButton(this);
            QObjectPrivate::connect(closeButton, &CloseButton::clicked,
                                    d, &QTabBarPrivate::closeTab);
            setTabButton(i, closeSide, closeButton);
        }
        if (newButtons)
            d->layoutTabs();
    }
    update();
}